

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O2

int Cec_ManFraClassesUpdate(Cec_ManFra_t *p,Cec_ManSim_t *pSim,Cec_ManPat_t *pPat,Gia_Man_t *pNew)

{
  Gia_Rpr_t GVar1;
  Gia_Rpr_t *pGVar2;
  ulong uVar3;
  int iVar4;
  uint v;
  int iVar5;
  abctime aVar6;
  Vec_Ptr_t *p_00;
  abctime aVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  int iVar12;
  Gia_Man_t *p_01;
  int local_40;
  
  aVar6 = Abc_Clock();
  p_00 = Cec_ManPatCollectPatterns(pPat,p->pAig->vCis->nSize,pSim->nWords);
  aVar7 = Abc_Clock();
  p->timePat = p->timePat + (aVar7 - aVar6);
  aVar6 = Abc_Clock();
  if (p_00 == (Vec_Ptr_t *)0x0) {
LAB_004deae9:
    aVar7 = Abc_Clock();
    p->timeSim = p->timeSim + (aVar7 - aVar6);
    if (p->vXorNodes->nSize != pNew->vCos->nSize * 2) {
      __assert_fail("Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                    ,0xd5,
                    "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                   );
    }
    if (p->pPars->nDepthMax != 1) {
      Gia_ManCleanMark0(p->pAig);
      Gia_ManCleanMark1(p->pAig);
      iVar4 = 0;
      iVar12 = 1;
      while ((iVar4 < pNew->vCos->nSize &&
             (pGVar8 = Gia_ManCo(pNew,iVar4), pGVar8 != (Gia_Obj_t *)0x0))) {
        Vec_IntEntry(p->vXorNodes,iVar12 + -1);
        iVar5 = Vec_IntEntry(p->vXorNodes,iVar12);
        if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x4000000040000000) !=
            (undefined1  [12])0x4000000000000000) {
          pGVar8 = Gia_ManObj(p->pAig,iVar5);
          pGVar8->field_0x3 = pGVar8->field_0x3 | 0x40;
        }
        iVar4 = iVar4 + 1;
        iVar12 = iVar12 + 2;
      }
      iVar12 = 0;
      while ((iVar12 < p->pAig->nObjs &&
             (pGVar8 = Gia_ManObj(p->pAig,iVar12), pGVar8 != (Gia_Obj_t *)0x0))) {
        uVar3 = *(ulong *)pGVar8;
        if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
          *(ulong *)pGVar8 =
               (*(uint *)(pGVar8 + -(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)) |
               *(uint *)(pGVar8 + -(uVar3 & 0x1fffffff))) & 0x40000000 | uVar3;
        }
        iVar12 = iVar12 + 1;
      }
      iVar4 = 0;
      iVar12 = 1;
      while ((iVar4 < pNew->vCos->nSize &&
             (pGVar8 = Gia_ManCo(pNew,iVar4), pGVar8 != (Gia_Obj_t *)0x0))) {
        Vec_IntEntry(p->vXorNodes,iVar12 + -1);
        iVar5 = Vec_IntEntry(p->vXorNodes,iVar12);
        if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x4000000040000000) !=
            (undefined1  [12])0x4000000000000000) {
          pGVar8 = Gia_ManObj(p->pAig,iVar5);
          uVar3 = *(ulong *)pGVar8;
          if (((uint)uVar3 >> 0x1e & 1) == 0) {
            __assert_fail("pObjOld->fMark0 == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0xef,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          if (((pGVar8[-(ulong)((uint)uVar3 & 0x1fffffff)].field_0x3 & 0x40) == 0) &&
             ((pGVar8[-(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
            *(ulong *)pGVar8 = uVar3 | 0x4000000000000000;
          }
        }
        iVar4 = iVar4 + 1;
        iVar12 = iVar12 + 2;
      }
      iVar12 = 0;
      while ((iVar12 < p->pAig->nObjs &&
             (pGVar8 = Gia_ManObj(p->pAig,iVar12), pGVar8 != (Gia_Obj_t *)0x0))) {
        uVar3 = *(ulong *)pGVar8;
        if ((uVar3 & 0x4000000080000000) == 0x4000000000000000 && (~(uint)uVar3 & 0x1fffffff) != 0)
        {
          *(ulong *)pGVar8 = uVar3 & 0xbfffffff3fffffff;
        }
        iVar12 = iVar12 + 1;
      }
    }
    p->nAllFailed = 0;
    p->nAllProved = 0;
    p->nAllDisproved = 0;
    local_40 = 0;
    iVar12 = 1;
    for (iVar4 = 0; iVar4 < pNew->vCos->nSize; iVar4 = iVar4 + 1) {
      pGVar8 = Gia_ManCo(pNew,iVar4);
      if (pGVar8 == (Gia_Obj_t *)0x0) {
        return 0;
      }
      v = Vec_IntEntry(p->vXorNodes,iVar12 + -1);
      iVar5 = Vec_IntEntry(p->vXorNodes,iVar12);
      pGVar9 = Gia_ManObj(p->pAig,v);
      p_01 = p->pAig;
      pGVar10 = Gia_ManObj(p_01,iVar5);
      uVar11 = (uint)*(ulong *)pGVar8;
      if ((*(ulong *)pGVar8 & 0x4000000000000000) == 0) {
        if ((uVar11 >> 0x1e & 1) == 0) {
          pGVar2 = p->pAig->pReprs;
          GVar1 = pGVar2[iVar5];
          if (((uint)GVar1 >> 0x1d & 1) != 0) {
            __assert_fail("!Gia_ObjFailed(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0x11e,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          if (((uint)GVar1 >> 0x1c & 1) != 0) {
            __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0x11f,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar2[iVar5] = (Gia_Rpr_t)((uint)GVar1 | 0x20000000);
          p->nAllFailed = p->nAllFailed + 1;
        }
        else if (((pGVar9->field_0x3 & 0x40) == 0) && ((pGVar10->field_0x3 & 0x40) == 0)) {
          if (v == ((uint)p->pAig->pReprs[iVar5] & 0xfffffff)) {
            Abc_Print((int)p_01,(char *)0x4000000000000000);
          }
          p->nAllDisproved = p->nAllDisproved + 1;
        }
      }
      else {
        if ((uVar11 >> 0x1e & 1) != 0) {
          __assert_fail("pObj->fMark0 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                        ,0x105,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        pGVar2 = p->pAig->pReprs;
        GVar1 = pGVar2[iVar5];
        if (((uint)GVar1 >> 0x1c & 1) != 0) {
          __assert_fail("!Gia_ObjProved(p->pAig, iNode)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                        ,0x106,
                        "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                       );
        }
        if (((pGVar9->field_0x3 & 0x40) == 0) && ((pGVar10->field_0x3 & 0x40) == 0)) {
          if (v != ((uint)GVar1 & 0xfffffff)) {
            __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iNode)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSweep.c"
                          ,0x10a,
                          "int Cec_ManFraClassesUpdate(Cec_ManFra_t *, Cec_ManSim_t *, Cec_ManPat_t *, Gia_Man_t *)"
                         );
          }
          pGVar2[iVar5] = (Gia_Rpr_t)((uint)GVar1 | 0x10000000);
          p->nAllProved = p->nAllProved + 1;
        }
      }
      iVar12 = iVar12 + 2;
    }
  }
  else {
    local_40 = 1;
    Gia_ManCreateValueRefs(p->pAig);
    iVar12 = 0;
    do {
      if (pPat->nSeries <= iVar12) {
        Vec_PtrFree(p_00);
        goto LAB_004deae9;
      }
      Cec_ManFraCreateInfo(pSim,pSim->vCiSimInfo,p_00,iVar12);
      iVar4 = Cec_ManSimSimulateRound(pSim,pSim->vCiSimInfo,pSim->vCoSimInfo);
      iVar12 = iVar12 + 1;
    } while (iVar4 == 0);
    Vec_PtrFree(p_00);
  }
  return local_40;
}

Assistant:

int Cec_ManFraClassesUpdate( Cec_ManFra_t * p, Cec_ManSim_t * pSim, Cec_ManPat_t * pPat, Gia_Man_t * pNew )
{
    Vec_Ptr_t * vInfo;
    Gia_Obj_t * pObj, * pObjOld, * pReprOld;
    int i, k, iRepr, iNode;
    abctime clk;
clk = Abc_Clock();
    vInfo = Cec_ManPatCollectPatterns( pPat, Gia_ManCiNum(p->pAig), pSim->nWords );
p->timePat += Abc_Clock() - clk;
clk = Abc_Clock();
    if ( vInfo != NULL )
    {
        Gia_ManCreateValueRefs( p->pAig );
        for ( i = 0; i < pPat->nSeries; i++ )
        {
            Cec_ManFraCreateInfo( pSim, pSim->vCiSimInfo, vInfo, i );
            if ( Cec_ManSimSimulateRound( pSim, pSim->vCiSimInfo, pSim->vCoSimInfo ) )
            {
                Vec_PtrFree( vInfo );
                return 1;
            }
        }
        Vec_PtrFree( vInfo );
    }
p->timeSim += Abc_Clock() - clk;
    assert( Vec_IntSize(p->vXorNodes) == 2*Gia_ManCoNum(pNew) );
    // mark the transitive fanout of failed nodes
    if ( p->pPars->nDepthMax != 1 )
    {
        Gia_ManCleanMark0( p->pAig );
        Gia_ManCleanMark1( p->pAig );
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue;
//            Gia_ManObj(p->pAig, iRepr)->fMark0 = 1;
            Gia_ManObj(p->pAig, iNode)->fMark0 = 1;
        }
        // mark the nodes reachable through the failed nodes
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            pObjOld->fMark0 |= (Gia_ObjFanin0(pObjOld)->fMark0 | Gia_ObjFanin1(pObjOld)->fMark0);
        // unmark the disproved nodes
        Gia_ManForEachCo( pNew, pObj, k )
        {
            iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
            iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
            if ( pObj->fMark0 == 0 && pObj->fMark1 == 1 ) // proved
                continue; 
            pObjOld = Gia_ManObj(p->pAig, iNode);
            assert( pObjOld->fMark0 == 1 );
            if ( Gia_ObjFanin0(pObjOld)->fMark0 == 0 && Gia_ObjFanin1(pObjOld)->fMark0 == 0 )
                pObjOld->fMark1 = 1;
        }
        // clean marks
        Gia_ManForEachAnd( p->pAig, pObjOld, k )
            if ( pObjOld->fMark1 )
            {
                pObjOld->fMark0 = 0;
                pObjOld->fMark1 = 0;
            }
    }
    // set the results
    p->nAllProved = p->nAllDisproved = p->nAllFailed = 0;
    Gia_ManForEachCo( pNew, pObj, k )
    {
        iRepr = Vec_IntEntry( p->vXorNodes, 2*k );
        iNode = Vec_IntEntry( p->vXorNodes, 2*k+1 );
        pReprOld = Gia_ManObj(p->pAig, iRepr);
        pObjOld = Gia_ManObj(p->pAig, iNode);
        if ( pObj->fMark1 )
        { // proved
            assert( pObj->fMark0 == 0 );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                assert( iRepr == Gia_ObjRepr(p->pAig, iNode) );
                Gia_ObjSetProved( p->pAig, iNode );
                p->nAllProved++;
            }
        }
        else if ( pObj->fMark0 )
        { // disproved
            assert( pObj->fMark1 == 0 );
            if ( pReprOld->fMark0 == 0 && pObjOld->fMark0 == 0 )
//            if ( pObjOld->fMark0 == 0 )
            {
                if ( iRepr == Gia_ObjRepr(p->pAig, iNode) )
                    Abc_Print( 1, "Cec_ManFraClassesUpdate(): Error! Node is not refined!\n" );
                p->nAllDisproved++;
            }
        }
        else
        { // failed
            assert( pObj->fMark0 == 0 );
            assert( pObj->fMark1 == 0 );
            assert( !Gia_ObjFailed(p->pAig, iNode) );
            assert( !Gia_ObjProved(p->pAig, iNode) );
            Gia_ObjSetFailed( p->pAig, iNode );
            p->nAllFailed++;
        }
    } 
    return 0;
}